

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O2

Config * __thiscall QPDFJob::Config::jsonOutput(Config *this,string *parameter)

{
  element_type *peVar1;
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  json_output = true;
  json(this,parameter);
  peVar1 = (this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1->json_stream_data_set == false) {
    peVar1->json_stream_data = qpdf_sj_inline;
  }
  if (peVar1->decode_level_set == false) {
    peVar1->decode_level = qpdf_dl_none;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"qpdf",&local_39);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&peVar1->json_keys,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::jsonOutput(std::string const& parameter)
{
    o.m->json_output = true;
    json(parameter);
    if (!o.m->json_stream_data_set) {
        // No need to set json_stream_data_set -- that indicates explicit use of --json-stream-data.
        o.m->json_stream_data = qpdf_sj_inline;
    }
    if (!o.m->decode_level_set) {
        o.m->decode_level = qpdf_dl_none;
    }
    o.m->json_keys.insert("qpdf");
    return this;
}